

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol.c
# Opt level: O0

int Test_SUNLinSolSetScalingVectors(SUNLinearSolver S,N_Vector s1,N_Vector s2,int myid)

{
  uint uVar1;
  uint in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  double dVar2;
  double dVar3;
  double stop_time;
  double start_time;
  int failure;
  int local_4;
  
  dVar2 = get_time();
  uVar1 = SUNLinSolSetScalingVectors(in_RDI,in_RSI,in_RDX);
  sync_device();
  dVar3 = get_time();
  if (uVar1 == 0) {
    if ((in_ECX == 0) &&
       (printf("    PASSED test -- SUNLinSolSetScalingVectors \n"), print_time != 0)) {
      printf("    SUNLinSolSetScalingVectors Time: %22.15e \n \n",dVar3 - dVar2);
    }
    local_4 = 0;
  }
  else {
    printf(">>> FAILED test -- SUNLinSolSetScalingVectors returned %d on Proc %d \n",(ulong)uVar1,
           (ulong)in_ECX);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int Test_SUNLinSolSetScalingVectors(SUNLinearSolver S, N_Vector s1, N_Vector s2,
                                    int myid)
{
  int failure;
  double start_time, stop_time;

  /* try calling SetScalingVectors routine: should pass/fail based on expected input */
  start_time = get_time();
  failure    = SUNLinSolSetScalingVectors(S, s1, s2);
  sync_device();
  stop_time = get_time();

  if (failure)
  {
    printf(">>> FAILED test -- SUNLinSolSetScalingVectors returned %d on Proc "
           "%d \n",
           failure, myid);
    return (1);
  }
  else if (myid == 0)
  {
    printf("    PASSED test -- SUNLinSolSetScalingVectors \n");
    PRINT_TIME("    SUNLinSolSetScalingVectors Time: %22.15e \n \n",
               stop_time - start_time);
  }

  return (0);
}